

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O1

ON_Object * __thiscall ON_ObjRef::ProxyObject(ON_ObjRef *this,int proxy_object_index)

{
  if (proxy_object_index == 2) {
    return this->m__proxy2;
  }
  if (proxy_object_index == 1) {
    return this->m__proxy1;
  }
  return (ON_Object *)0x0;
}

Assistant:

const ON_Object* ON_ObjRef::ProxyObject(int proxy_object_index) const
{
  return ( (1 == proxy_object_index) 
           ? m__proxy1 
           : ((2==proxy_object_index) ? m__proxy2 : 0) 
         );
}